

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O3

void __thiscall
QtMWidgets::AbstractListView<QImage>::setModel(AbstractListView<QImage> *this,ListModel<QImage> *m)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollArea *pAVar2;
  AbstractListView<QImage> *pAVar3;
  undefined4 *puVar4;
  QSlotObjectBase local_88;
  AbstractScrollAreaPrivate *local_78;
  AbstractListView<QImage> *local_70;
  code *local_68;
  undefined8 local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  if (pAVar1[1].q != (AbstractScrollArea *)0x0) {
    QObject::disconnect((QObject *)pAVar1[1].q,(char *)0x0,(QObject *)this,(char *)0x0);
  }
  pAVar1[1].q = (AbstractScrollArea *)m;
  local_68 = AbstractListModel::dataChanged;
  local_60 = 0;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c1;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  local_78 = pAVar1;
  local_70 = this;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractListView<QImage>::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1c1;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)m,(QObject *)&local_68,(void **)this,&local_88,(ConnectionType)puVar4
             ,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pAVar2 = pAVar1[1].q;
  local_68 = AbstractListModel::modelReset;
  local_60 = 0;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c9;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  pAVar3 = local_70;
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractListView<QImage>::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1c9;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pAVar2,(QObject *)&local_68,(void **)local_70,&local_88,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pAVar1 = local_78;
  pAVar2 = local_78[1].q;
  local_68 = AbstractListModel::rowsInserted;
  local_60 = 0;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1d1;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractListView<QImage>::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1d1;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pAVar2,(QObject *)&local_68,(void **)pAVar3,&local_88,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pAVar2 = pAVar1[1].q;
  local_68 = AbstractListModel::rowsRemoved;
  local_60 = 0;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1d9;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractListView<QImage>::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1d9;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pAVar2,(QObject *)&local_68,(void **)pAVar3,&local_88,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pAVar2 = local_78[1].q;
  local_68 = AbstractListModel::rowsMoved;
  local_60 = 0;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1e1;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractListView<QImage>::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>
       ::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1e1;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pAVar2,(QObject *)&local_68,(void **)local_70,&local_88,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  return;
}

Assistant:

void setModel( ListModel< T > * m )
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->model )
			disconnect( d->model, 0, this, 0 );

		d->model = m;

		connect( d->model, &ListModel< T >::dataChanged,
			this, &AbstractListView< T >::dataChanged );
		connect( d->model, &ListModel< T >::modelReset,
			this, &AbstractListView< T >::modelReset );
		connect( d->model, &ListModel< T >::rowsInserted,
			this, &AbstractListView< T >::rowsInserted );
		connect( d->model, &ListModel< T >::rowsRemoved,
			this, &AbstractListView< T >::rowsRemoved );
		connect( d->model, &ListModel< T >::rowsMoved,
			this, &AbstractListView< T >::rowsMoved );
	}